

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Element * __thiscall Rml::Element::GetPreviousSibling(Element *this)

{
  size_type sVar1;
  reference pvVar2;
  pointer pEVar3;
  ulong local_20;
  size_t i;
  Element *this_local;
  
  if (this->parent != (Element *)0x0) {
    for (local_20 = 1;
        sVar1 = ::std::
                vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                ::size(&this->parent->children),
        local_20 < sVar1 - (long)this->parent->num_non_dom_children; local_20 = local_20 + 1) {
      pvVar2 = ::std::
               vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
               ::operator[](&this->parent->children,local_20);
      pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(pvVar2);
      if (pEVar3 == this) {
        pvVar2 = ::std::
                 vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                 ::operator[](&this->parent->children,local_20 - 1);
        pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(pvVar2);
        return pEVar3;
      }
    }
  }
  return (Element *)0x0;
}

Assistant:

Element* Element::GetPreviousSibling() const
{
	if (parent == nullptr)
		return nullptr;

	for (size_t i = 1; i < parent->children.size() - parent->num_non_dom_children; i++)
	{
		if (parent->children[i].get() == this)
			return parent->children[i - 1].get();
	}

	return nullptr;
}